

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauss_jordan.cpp
# Opt level: O1

void opengv::math::gauss_jordan
               (vector<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
                *matrix,int exitCondition)

{
  long *plVar1;
  undefined1 (*pauVar2) [64];
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  pointer ppvVar6;
  vector<double,_std::allocator<double>_> *pvVar7;
  long lVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  ulong uVar16;
  int tempRow;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  int col;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  int iVar25;
  ulong uVar26;
  long lVar27;
  int iVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  int col_1;
  vector<int,_std::allocator<int>_> nonzeroIdx;
  int local_5c;
  void *local_58;
  iterator iStack_50;
  int *local_48;
  long local_40;
  int local_38;
  int local_34;
  
  ppvVar6 = (matrix->
            super__Vector_base<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pvVar7 = *ppvVar6;
  uVar17 = (uint)((ulong)((long)(matrix->
                                super__Vector_base<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)ppvVar6) >> 3);
  iVar25 = (int)((ulong)((long)*(pointer *)
                                ((long)&(pvVar7->super__Vector_base<double,_std::allocator<double>_>
                                        )._M_impl.super__Vector_impl_data + 8) -
                        *(long *)&(pvVar7->super__Vector_base<double,_std::allocator<double>_>).
                                  _M_impl.super__Vector_impl_data) >> 3);
  if ((int)uVar17 < 1) {
    uVar22 = 0xffffffff;
  }
  else {
    local_40 = (long)iVar25;
    uVar26 = (ulong)(uVar17 & 0x7fffffff);
    local_34 = iVar25 + -2;
    uVar19 = 1;
    uVar18 = 0;
    local_38 = exitCondition;
    do {
      uVar22 = uVar18;
      uVar16 = 0xffffffff;
      auVar29 = ZEXT816(0xbff0000000000000);
      auVar42._8_8_ = 0x7fffffffffffffff;
      auVar42._0_8_ = 0x7fffffffffffffff;
      uVar18 = uVar22;
      do {
        auVar39._8_8_ = 0;
        auVar39._0_8_ =
             *(ulong *)(*(long *)&((matrix->
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
                                   )._M_impl.super__Vector_impl_data._M_start[uVar18]->
                                  super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                  super__Vector_impl_data + uVar22 * 8);
        auVar39 = vandpd_avx(auVar39,auVar42);
        if (auVar29._0_8_ < auVar39._0_8_) {
          uVar16 = uVar18 & 0xffffffff;
        }
        auVar29 = vmaxsd_avx(auVar39,auVar29);
        uVar18 = uVar18 + 1;
      } while (uVar26 != uVar18);
      ppvVar6 = (matrix->
                super__Vector_base<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pvVar7 = ppvVar6[(int)uVar16];
      ppvVar6[(int)uVar16] = ppvVar6[uVar22];
      ppvVar6[uVar22] = pvVar7;
      iVar28 = (int)uVar22;
      lVar27 = *(long *)&((matrix->
                          super__Vector_base<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
                          )._M_impl.super__Vector_impl_data._M_start[uVar22]->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data;
      dVar3 = *(double *)(lVar27 + uVar22 * 8);
      *(undefined8 *)(lVar27 + uVar22 * 8) = 0x3ff0000000000000;
      auVar30 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      if (iVar28 + 1 < iVar25) {
        auVar29._0_8_ = 1.0 / dVar3;
        auVar29._8_8_ = 0;
        auVar31 = vpbroadcastq_avx512f();
        auVar32 = vbroadcastsd_avx512f(auVar29);
        lVar27 = lVar27 + 8 + (long)iVar28 * 8;
        uVar18 = 0;
        do {
          auVar33 = vpbroadcastq_avx512f();
          auVar33 = vporq_avx512f(auVar33,auVar30);
          uVar16 = vpcmpuq_avx512f(auVar33,auVar31,2);
          plVar1 = (long *)(lVar27 + uVar18 * 8);
          auVar33._8_8_ = (ulong)((byte)(uVar16 >> 1) & 1) * plVar1[1];
          auVar33._0_8_ = (ulong)((byte)uVar16 & 1) * *plVar1;
          auVar33._16_8_ = (ulong)((byte)(uVar16 >> 2) & 1) * plVar1[2];
          auVar33._24_8_ = (ulong)((byte)(uVar16 >> 3) & 1) * plVar1[3];
          auVar33._32_8_ = (ulong)((byte)(uVar16 >> 4) & 1) * plVar1[4];
          auVar33._40_8_ = (ulong)((byte)(uVar16 >> 5) & 1) * plVar1[5];
          auVar33._48_8_ = (ulong)((byte)(uVar16 >> 6) & 1) * plVar1[6];
          auVar33._56_8_ = (uVar16 >> 7) * plVar1[7];
          auVar33 = vmulpd_avx512f(auVar32,auVar33);
          pauVar2 = (undefined1 (*) [64])(lVar27 + uVar18 * 8);
          bVar9 = (bool)((byte)uVar16 & 1);
          auVar34._0_8_ = (ulong)bVar9 * auVar33._0_8_ | (ulong)!bVar9 * *(long *)*pauVar2;
          bVar9 = (bool)((byte)(uVar16 >> 1) & 1);
          auVar34._8_8_ = (ulong)bVar9 * auVar33._8_8_ | (ulong)!bVar9 * *(long *)(*pauVar2 + 8);
          bVar9 = (bool)((byte)(uVar16 >> 2) & 1);
          auVar34._16_8_ =
               (ulong)bVar9 * auVar33._16_8_ | (ulong)!bVar9 * *(long *)(*pauVar2 + 0x10);
          bVar9 = (bool)((byte)(uVar16 >> 3) & 1);
          auVar34._24_8_ =
               (ulong)bVar9 * auVar33._24_8_ | (ulong)!bVar9 * *(long *)(*pauVar2 + 0x18);
          bVar9 = (bool)((byte)(uVar16 >> 4) & 1);
          auVar34._32_8_ =
               (ulong)bVar9 * auVar33._32_8_ | (ulong)!bVar9 * *(long *)(*pauVar2 + 0x20);
          bVar9 = (bool)((byte)(uVar16 >> 5) & 1);
          auVar34._40_8_ =
               (ulong)bVar9 * auVar33._40_8_ | (ulong)!bVar9 * *(long *)(*pauVar2 + 0x28);
          bVar9 = (bool)((byte)(uVar16 >> 6) & 1);
          auVar34._48_8_ =
               (ulong)bVar9 * auVar33._48_8_ | (ulong)!bVar9 * *(long *)(*pauVar2 + 0x30);
          auVar34._56_8_ =
               (uVar16 >> 7) * auVar33._56_8_ |
               (ulong)!SUB81(uVar16 >> 7,0) * *(long *)(*pauVar2 + 0x38);
          *pauVar2 = auVar34;
          uVar18 = uVar18 + 8;
        } while (((ulong)(uint)(local_34 - iVar28) + 8 & 0xfffffffffffffff8) != uVar18);
      }
      local_58 = (void *)0x0;
      iStack_50._M_current = (int *)0x0;
      local_48 = (int *)0x0;
      local_5c = iVar28;
      std::vector<int,_std::allocator<int>_>::reserve
                ((vector<int,_std::allocator<int>_> *)&local_58,local_40 - uVar22);
      for (; local_5c < iVar25; local_5c = local_5c + 1) {
        auVar35._8_8_ = 0;
        auVar35._0_8_ =
             *(ulong *)(*(long *)&((matrix->
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
                                   )._M_impl.super__Vector_impl_data._M_start[uVar22]->
                                  super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                  super__Vector_impl_data + (long)local_5c * 8);
        auVar10._8_8_ = 0x7fffffffffffffff;
        auVar10._0_8_ = 0x7fffffffffffffff;
        auVar29 = vandpd_avx512vl(auVar35,auVar10);
        if (1e-10 < auVar29._0_8_) {
          if (iStack_50._M_current == local_48) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_58,iStack_50,&local_5c);
          }
          else {
            *iStack_50._M_current = local_5c;
            iStack_50._M_current = iStack_50._M_current + 1;
          }
        }
      }
      uVar18 = uVar22 + 1;
      if (uVar18 < uVar26) {
        ppvVar6 = (matrix->
                  super__Vector_base<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        uVar17 = (uint)((ulong)((long)iStack_50._M_current - (long)local_58) >> 2);
        uVar16 = uVar19;
        do {
          lVar27 = *(long *)&(ppvVar6[uVar16]->super__Vector_base<double,_std::allocator<double>_>).
                             _M_impl.super__Vector_impl_data;
          auVar36._8_8_ = 0;
          auVar36._0_8_ = *(ulong *)(lVar27 + uVar22 * 8);
          auVar11._8_8_ = 0x7fffffffffffffff;
          auVar11._0_8_ = 0x7fffffffffffffff;
          auVar29 = vandpd_avx512vl(auVar36,auVar11);
          if ((1e-10 < auVar29._0_8_) && (0 < (int)uVar17)) {
            lVar20 = *(long *)&(ppvVar6[uVar22]->super__Vector_base<double,_std::allocator<double>_>
                               )._M_impl.super__Vector_impl_data;
            auVar12._8_8_ = 0x8000000000000000;
            auVar12._0_8_ = 0x8000000000000000;
            auVar29 = vxorpd_avx512vl(auVar36,auVar12);
            uVar21 = 0;
            do {
              lVar23 = (long)*(int *)((long)local_58 + uVar21 * 4);
              auVar40._8_8_ = 0;
              auVar40._0_8_ = *(ulong *)(lVar20 + lVar23 * 8);
              auVar4._8_8_ = 0;
              auVar4._0_8_ = *(ulong *)(lVar27 + lVar23 * 8);
              auVar42 = vfmadd213sd_fma(auVar40,auVar29,auVar4);
              *(long *)(lVar27 + lVar23 * 8) = auVar42._0_8_;
              uVar21 = uVar21 + 1;
            } while ((uVar17 & 0x7fffffff) != uVar21);
          }
          uVar16 = uVar16 + 1;
          local_5c = iVar28;
        } while (uVar16 != uVar26);
      }
      if (local_58 != (void *)0x0) {
        operator_delete(local_58);
      }
      uVar19 = uVar19 + 1;
      exitCondition = local_38;
    } while (uVar18 != uVar26);
  }
  if (exitCondition < (int)uVar22) {
    lVar27 = (long)(int)uVar22;
    local_40 = (long)iVar25;
    do {
      local_5c = (int)lVar27;
      local_58 = (void *)0x0;
      iStack_50._M_current = (int *)0x0;
      local_48 = (int *)0x0;
      std::vector<int,_std::allocator<int>_>::reserve
                ((vector<int,_std::allocator<int>_> *)&local_58,local_40 - lVar27);
      for (; local_5c < iVar25; local_5c = local_5c + 1) {
        auVar37._8_8_ = 0;
        auVar37._0_8_ =
             *(ulong *)(*(long *)&((matrix->
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
                                   )._M_impl.super__Vector_impl_data._M_start[lVar27]->
                                  super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                  super__Vector_impl_data + (long)local_5c * 8);
        auVar13._8_8_ = 0x7fffffffffffffff;
        auVar13._0_8_ = 0x7fffffffffffffff;
        auVar29 = vandpd_avx512vl(auVar37,auVar13);
        if (1e-10 < auVar29._0_8_) {
          if (iStack_50._M_current == local_48) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_58,iStack_50,&local_5c);
          }
          else {
            *iStack_50._M_current = local_5c;
            iStack_50._M_current = iStack_50._M_current + 1;
          }
        }
      }
      ppvVar6 = (matrix->
                super__Vector_base<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      uVar17 = (uint)((ulong)((long)iStack_50._M_current - (long)local_58) >> 2);
      lVar20 = lVar27;
      do {
        lVar23 = *(long *)&(ppvVar6[lVar20 + -1]->
                           super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data;
        auVar38._8_8_ = 0;
        auVar38._0_8_ = *(ulong *)(lVar23 + lVar27 * 8);
        auVar14._8_8_ = 0x7fffffffffffffff;
        auVar14._0_8_ = 0x7fffffffffffffff;
        auVar29 = vandpd_avx512vl(auVar38,auVar14);
        if ((1e-10 < auVar29._0_8_) && (0 < (int)uVar17)) {
          lVar8 = *(long *)&(ppvVar6[lVar27]->super__Vector_base<double,_std::allocator<double>_>).
                            _M_impl.super__Vector_impl_data;
          auVar15._8_8_ = 0x8000000000000000;
          auVar15._0_8_ = 0x8000000000000000;
          auVar29 = vxorpd_avx512vl(auVar38,auVar15);
          uVar22 = 0;
          do {
            lVar24 = (long)*(int *)((long)local_58 + uVar22 * 4);
            auVar41._8_8_ = 0;
            auVar41._0_8_ = *(ulong *)(lVar8 + lVar24 * 8);
            auVar5._8_8_ = 0;
            auVar5._0_8_ = *(ulong *)(lVar23 + lVar24 * 8);
            auVar42 = vfmadd213sd_fma(auVar41,auVar29,auVar5);
            *(long *)(lVar23 + lVar24 * 8) = auVar42._0_8_;
            uVar22 = uVar22 + 1;
          } while ((uVar17 & 0x7fffffff) != uVar22);
        }
        lVar20 = lVar20 + -1;
      } while (exitCondition < lVar20);
      if (local_58 != (void *)0x0) {
        operator_delete(local_58);
      }
      lVar27 = lVar27 + -1;
    } while (exitCondition < lVar27);
  }
  return;
}

Assistant:

void
opengv::math::gauss_jordan(
    std::vector<std::vector<double>*> & matrix, int exitCondition )
{  
  //create some constants for zero-checking etc.
  double precision = 1.0e-10;
  int rows = matrix.size();
  int cols = matrix[0]->size();
  
  //the working row
  int frontRow;
  
  //first step down
  for( frontRow = 0; frontRow < rows; frontRow++ )
  {
    // first iterate through the rows and find the row that has the biggest
    // leading coefficient
    double maxValue = -1.0;
    int row = -1;
    for( int tempRow = frontRow; tempRow < rows; tempRow++ )
    {
      double value = fabs((*(matrix[tempRow]))[frontRow]);
      if( value > maxValue )
      {
        row = tempRow;
        maxValue = value;
      }
    }
    
    //rowIter is now the row that should go in the place of frontRow->swap    
    std::swap( matrix[row], matrix[frontRow] );
    
    //ok, now use frontRow!
    
    //first divide all coefficients by the leading coefficient
    int col = frontRow;
    double leadingCoefficient_inv = 1.0 / (*(matrix[frontRow]))[col];
    (*(matrix[frontRow]))[col] = 1.0;
    ++col;
    while( col < cols )
    {
      (*(matrix[frontRow]))[col] *= leadingCoefficient_inv;
      ++col;
    }
    
    //create a vector of bools indicating the cols that need to be manipulated
    col = frontRow;
    std::vector<int> nonzeroIdx;
    nonzeroIdx.reserve( cols - frontRow );
    while( col < cols )
    {
      if( fabs(((*(matrix[frontRow]))[col])) > precision )
        nonzeroIdx.push_back(col);
      col++;
    }
    
    //iterate through all remaining rows, and subtract correct multiple of 
    //first row (if leading coefficient is non-zero!)
    row = frontRow;
    ++row;
    while( row < rows )
    {
      col = frontRow;
      double leadingCoefficient = (*(matrix[row]))[col];
      
      if( fabs(leadingCoefficient) > precision )
      {
        for( int col = 0; col < (int) nonzeroIdx.size(); col++ )
          (*(matrix[row]))[nonzeroIdx[col]] -=
              leadingCoefficient * ((*(matrix[frontRow]))[nonzeroIdx[col]]);
      }
      
      ++row;
    }
  }
  
  //set index to the last non-zero row
  --frontRow;
  
  //Now step up
  while( frontRow > exitCondition )
  {    
    //create a vector of bools indicating the cols that need to be manipulated
    int col = frontRow;
    std::vector<int> nonzeroIdx;
    nonzeroIdx.reserve( cols - frontRow );
    while( col < cols )
    {
      if( fabs(((*(matrix[frontRow]))[col])) > precision )
        nonzeroIdx.push_back(col);
      col++;
    }
    
    //get the working row
    int row = frontRow;
    
    do
    {      
      //decrement working row
      --row;
      
      //working column
      
      //now get the leading coefficient
      double leadingCoefficient = (*(matrix[row]))[frontRow];
      
      //Now iterator until the end, and subtract each time the multiplied
      //front-row
      if( fabs(leadingCoefficient) > precision )
      {        
        for( int col = 0; col < (int) nonzeroIdx.size(); col++ )
          (*(matrix[row]))[nonzeroIdx[col]] -=
              leadingCoefficient * (*(matrix[frontRow]))[nonzeroIdx[col]];
      }
    }
    while( row > exitCondition );
    
    --frontRow;
  }
}